

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void LiteScript::StateExecutor::I_POP_NSP(State *state,Instruction *instr)

{
  pointer pNVar1;
  Variable VStack_28;
  
  state->line_num = state->line_num + 1;
  pNVar1 = (state->rets).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar1 != (state->rets).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    Variable::Variable(&VStack_28,(Variable *)(pNVar1 + -1));
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
    emplace_back<LiteScript::Variable>(&state->op_lifo,&VStack_28);
    Variable::~Variable(&VStack_28);
    std::
    vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
    ::pop_back(&state->rets);
  }
  if ((state->ths).
      super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (state->ths).
      super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
    ::pop_back(&state->ths);
  }
  if (1 < (ulong)(((long)(state->nsp_lifo).
                         super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(state->nsp_lifo).
                        super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x48)) {
    std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::pop_back(&state->nsp_lifo);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_POP_NSP(State& state, Instruction& instr) {
    state.line_num++;
    if (state.rets.size() > 0) {
        state.op_lifo.push_back(Variable(*state.rets.back()));
        state.rets.pop_back();
    }
    if (state.ths.size() > 0)
        state.ths.pop_back();
    if (state.nsp_lifo.size() > 1)
        state.nsp_lifo.pop_back();
}